

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

void helicsPublicationPublishString(HelicsPublication pub,char *str,HelicsError *err)

{
  Publication *this;
  PublicationObject *pPVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  string_view val;
  
  pPVar1 = anon_unknown.dwarf_7c49a::verifyPublication(pub,err);
  if (pPVar1 != (PublicationObject *)0x0) {
    this = pPVar1->pubPtr;
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var3 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (str != (char *)0x0) {
      sVar2 = strlen(str);
      _Var3._M_p = str;
    }
    val._M_str = _Var3._M_p;
    val._M_len = sVar2;
    helics::Publication::publishString(this,val);
  }
  return;
}

Assistant:

void helicsPublicationPublishString(HelicsPublication pub, const char* str, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish(AS_STRING_VIEW(str));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}